

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1::AccumulateFloatArray(ON_SHA1 *this,size_t count,float *a)

{
  float *pfVar1;
  float v;
  
  if (a != (float *)0x0 && count != 0) {
    pfVar1 = a + count;
    for (; a < pfVar1; a = a + 1) {
      v = (float)(~-(uint)(*a == 0.0) & (uint)*a);
      Internal_SwapBigEndianUpdate(this,&v,4);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateFloatArray(
  size_t count,
  const float* a
)
{
  if (count > 0 && nullptr != a)
  {
    float x, v;
    const float* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      v = (0.0f == x ? 0.0f : x);
      Internal_SwapBigEndianUpdate(&v, sizeof(v));
    }
  }
}